

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O3

void __thiscall
DScroller::DScroller
          (DScroller *this,double dx,double dy,line_t *l,int control,int accel,EScrollPos scrollpos)

{
  BYTE *pBVar1;
  side_t *psVar2;
  DInterpolation *pDVar3;
  TObjPtr<DInterpolation> TVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  DThinker::DThinker(&this->super_DThinker,0x20);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_008727b8;
  dVar6 = ABS((l->delta).X);
  dVar9 = ABS((l->delta).Y);
  dVar7 = dVar6;
  if (dVar9 <= dVar6) {
    dVar7 = dVar9;
    dVar9 = dVar6;
  }
  dVar7 = c_atan2(dVar7,dVar9);
  dVar8 = FFastTrig::sin(&fasttrig,
                         (dVar7 + 1.5707963267948966) * 683565275.5764316 + 6755399441055744.0);
  this->m_Type = sc_side;
  dVar7 = (l->delta).X;
  dVar6 = (l->delta).Y;
  auVar10._0_8_ = -(dx * dVar7 + dVar6 * dy);
  auVar10._8_8_ = -(dx * dVar6 - dVar7 * dy);
  auVar11._8_8_ = dVar9 / dVar8;
  auVar11._0_8_ = dVar9 / dVar8;
  auVar11 = divpd(auVar10,auVar11);
  this->m_dx = (double)auVar11._0_8_;
  this->m_dy = (double)auVar11._8_8_;
  this->m_vdx = 0.0;
  this->m_vdy = 0.0;
  this->m_Accel = accel;
  this->m_Parts = scrollpos;
  this->m_Control = control;
  if (control != -1) {
    dVar9 = sectors[control].centerspot.X;
    dVar7 = sectors[control].centerspot.Y;
    this->m_LastHeight =
         sectors[control].ceilingplane.negiC *
         (sectors[control].ceilingplane.normal.Y * dVar7 +
         sectors[control].ceilingplane.D + sectors[control].ceilingplane.normal.X * dVar9) +
         sectors[control].floorplane.negiC *
         (dVar7 * sectors[control].floorplane.normal.Y +
         sectors[control].floorplane.D + dVar9 * sectors[control].floorplane.normal.X);
  }
  psVar2 = sides;
  iVar5 = (int)((long)l->sidedef[0] - (long)sides >> 3) * 0x684bda13;
  this->m_Affectee = iVar5;
  pBVar1 = &psVar2[iVar5].Flags;
  *pBVar1 = *pBVar1 | 2;
  this->m_Interpolations[0].field_0.p = (DInterpolation *)0x0;
  this->m_Interpolations[1].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
  this->m_Interpolations[2].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
  if ((scrollpos & scw_top) != 0) {
    pDVar3 = side_t::SetInterpolation(psVar2 + iVar5,0);
    this->m_Interpolations[0].field_0.p = pDVar3;
    scrollpos = this->m_Parts;
  }
  if ((scrollpos & scw_mid) != 0) {
    if (((sides[this->m_Affectee].linedef)->backsector == (sector_t *)0x0) ||
       (((sides[this->m_Affectee].linedef)->flags & 0x200000) == 0)) {
      TVar4.field_0 =
           (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)
           side_t::SetInterpolation(sides + this->m_Affectee,1);
      this->m_Interpolations[1].field_0 = TVar4.field_0;
      scrollpos = this->m_Parts;
    }
  }
  if ((scrollpos & scw_bottom) != 0) {
    TVar4.field_0 =
         (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)
         side_t::SetInterpolation(sides + this->m_Affectee,2);
    this->m_Interpolations[2].field_0 = TVar4.field_0;
  }
  return;
}

Assistant:

DScroller::DScroller (double dx, double dy, const line_t *l,
					 int control, int accel, EScrollPos scrollpos)
	: DThinker (STAT_SCROLLER)
{
	double x = fabs(l->Delta().X), y = fabs(l->Delta().Y), d;
	if (y > x) d = x, x = y, y = d;

	d = x / g_sin(g_atan2(y, x) + M_PI / 2);
	x = -(dy * l->Delta().Y + dx * l->Delta().X) / d;
	y = -(dx * l->Delta().Y - dy * l->Delta().X) / d;

	m_Type = EScroll::sc_side;
	m_dx = x;
	m_dy = y;
	m_vdx = m_vdy = 0;
	m_Accel = accel;
	m_Parts = scrollpos;
	if ((m_Control = control) != -1)
		m_LastHeight = sectors[control].CenterFloor() + sectors[control].CenterCeiling();
	m_Affectee = int(l->sidedef[0] - sides);
	sides[m_Affectee].Flags |= WALLF_NOAUTODECALS;
	m_Interpolations[0] = m_Interpolations[1] = m_Interpolations[2] = NULL;

	if (m_Parts & EScrollPos::scw_top)
	{
		m_Interpolations[0] = sides[m_Affectee].SetInterpolation(side_t::top);
	}
	if (m_Parts & EScrollPos::scw_mid && (sides[m_Affectee].linedef->backsector == NULL ||
		!(sides[m_Affectee].linedef->flags&ML_3DMIDTEX)))
	{
		m_Interpolations[1] = sides[m_Affectee].SetInterpolation(side_t::mid);
	}
	if (m_Parts & EScrollPos::scw_bottom)
	{
		m_Interpolations[2] = sides[m_Affectee].SetInterpolation(side_t::bottom);
	}
}